

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collection.cpp
# Opt level: O3

bool doVisit<(arangodb::velocypack::Collection::VisitationOrder)1>
               (Slice slice,
               function<bool_(arangodb::velocypack::Slice,_arangodb::velocypack::Slice)> *func)

{
  bool bVar1;
  Slice SVar2;
  Exception *this;
  ObjectPair OVar3;
  ObjectIterator it;
  Slice local_60;
  Slice local_58;
  ObjectIterator local_50;
  
  if (arangodb::velocypack::SliceStaticData::TypeMap[*slice._start] == Array) {
    arangodb::velocypack::ArrayIterator::ArrayIterator((ArrayIterator *)&local_50,slice);
    if (local_50._position == local_50._size) {
      return true;
    }
    do {
      SVar2 = arangodb::velocypack::ArrayIterator::value((ArrayIterator *)&local_50);
      if (((arangodb::velocypack::SliceStaticData::TypeMap[*SVar2._start] & ~Illegal) == Array) &&
         (bVar1 = doVisit<(arangodb::velocypack::Collection::VisitationOrder)1>(SVar2,func), !bVar1)
         ) {
        return false;
      }
      local_58._start = "";
      OVar3.value._start = SVar2._start;
      OVar3.key._start = "";
      if ((func->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_0010a244;
      local_60 = SVar2;
      bVar1 = (*func->_M_invoker)((_Any_data *)func,&local_58,&local_60);
      if (!bVar1) {
        return false;
      }
      arangodb::velocypack::ArrayIterator::next((ArrayIterator *)&local_50);
    } while (local_50._position != local_50._size);
  }
  else {
    if (arangodb::velocypack::SliceStaticData::TypeMap[*slice._start] != Object) {
      this = (Exception *)__cxa_allocate_exception(0x18);
      arangodb::velocypack::Exception::Exception
                (this,InvalidValueType,"Expecting type Object or Array");
      __cxa_throw(this,&arangodb::velocypack::Exception::typeinfo,
                  arangodb::velocypack::Exception::~Exception);
    }
    arangodb::velocypack::ObjectIterator::ObjectIterator(&local_50,slice,false);
    if (local_50._position == local_50._size) {
      return true;
    }
    do {
      OVar3 = arangodb::velocypack::ObjectIterator::operator*(&local_50);
      SVar2 = OVar3.value._start;
      if (((arangodb::velocypack::SliceStaticData::TypeMap[*SVar2._start] & ~Illegal) == Array) &&
         (bVar1 = doVisit<(arangodb::velocypack::Collection::VisitationOrder)1>(SVar2,func), !bVar1)
         ) {
        return false;
      }
      if ((func->super__Function_base)._M_manager == (_Manager_type)0x0) {
LAB_0010a244:
        local_60 = OVar3.value._start;
        local_58 = OVar3.key._start;
        std::__throw_bad_function_call();
      }
      local_60._start = SVar2._start;
      local_58._start = OVar3.key._start._start;
      bVar1 = (*func->_M_invoker)((_Any_data *)func,&local_58,&local_60);
      if (!bVar1) {
        return false;
      }
      arangodb::velocypack::ObjectIterator::next(&local_50);
    } while (local_50._position != local_50._size);
  }
  return true;
}

Assistant:

static bool doVisit(
    Slice slice,
    std::function<bool(Slice key, Slice value)> const& func) {
  if (slice.isObject()) {
    return visitObject<order>(slice, func);
  }
  if (slice.isArray()) {
    return visitArray<order>(slice, func);
  }

  throw Exception(Exception::InvalidValueType,
                  "Expecting type Object or Array");
}